

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_67::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  Result RVar1;
  IfExceptExpr *pIVar2;
  Location local_48;
  LabelNode *local_28;
  LabelNode *label;
  Expr *expr;
  
  RVar1 = TopLabelExpr(this,&local_28,(Expr **)&label);
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  switch(local_28->label_type) {
  case Block:
    GetLocation(&local_48,this);
    pIVar2 = (IfExceptExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>((Expr *)label);
    break;
  case Loop:
    GetLocation(&local_48,this);
    pIVar2 = (IfExceptExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>((Expr *)label)
    ;
    break;
  case If:
    GetLocation(&local_48,this);
    pIVar2 = (IfExceptExpr *)cast<wabt::IfExpr,wabt::Expr>((Expr *)label);
    break;
  case Else:
    GetLocation(&local_48,this);
    pIVar2 = (IfExceptExpr *)cast<wabt::IfExpr,wabt::Expr>((Expr *)label);
    goto LAB_00d8050b;
  case IfExcept:
    GetLocation(&local_48,this);
    pIVar2 = cast<wabt::IfExceptExpr,wabt::Expr>((Expr *)label);
    break;
  case IfExceptElse:
    GetLocation(&local_48,this);
    pIVar2 = cast<wabt::IfExceptExpr,wabt::Expr>((Expr *)label);
LAB_00d8050b:
    (pIVar2->false_end_loc).filename.data_ = local_48.filename.data_;
    (pIVar2->false_end_loc).filename.size_ = local_48.filename.size_;
    (pIVar2->false_end_loc).field_1.field_1.offset = (size_t)local_48.field_1.field_1.offset;
    *(undefined8 *)((long)&(pIVar2->false_end_loc).field_1 + 8) = local_48.field_1._8_8_;
    goto switchD_00d80469_default;
  case Try:
    GetLocation(&local_48,this);
    pIVar2 = (IfExceptExpr *)cast<wabt::TryExpr,wabt::Expr>((Expr *)label);
    break;
  default:
    goto switchD_00d80469_default;
  }
  (pIVar2->true_).end_loc.filename.data_ = local_48.filename.data_;
  (pIVar2->true_).end_loc.filename.size_ = local_48.filename.size_;
  (pIVar2->true_).end_loc.field_1.field_1.offset = (size_t)local_48.field_1.field_1.offset;
  *(undefined8 *)((long)&(pIVar2->true_).end_loc.field_1 + 8) = local_48.field_1._8_8_;
switchD_00d80469_default:
  RVar1 = PopLabel(this);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));
  switch (label->label_type) {
    case LabelType::Block:
      cast<BlockExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::Loop:
      cast<LoopExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::If:
      cast<IfExpr>(expr)->true_.end_loc = GetLocation();
      break;
    case LabelType::Else:
      cast<IfExpr>(expr)->false_end_loc = GetLocation();
      break;
    case LabelType::IfExcept:
      cast<IfExceptExpr>(expr)->true_.end_loc = GetLocation();
      break;
    case LabelType::IfExceptElse:
      cast<IfExceptExpr>(expr)->false_end_loc = GetLocation();
      break;
    case LabelType::Try:
      cast<TryExpr>(expr)->block.end_loc = GetLocation();
      break;

    case LabelType::Func:
    case LabelType::Catch:
      break;
  }

  return PopLabel();
}